

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O2

void __thiscall OpenMD::MAW::calcForce(MAW *this,InteractionData *idat)

{
  double dVar1;
  pointer piVar2;
  long lVar3;
  byte bVar4;
  RectMatrix<double,_3U,_3U> *m;
  RectMatrix<double,_3U,_3U> *m_00;
  Vector3d *this_00;
  long lVar5;
  RotMat3x3d *this_01;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  RealType RVar15;
  double dVar16;
  Vector3d r;
  Vector3d ftmp;
  Vector3d trq;
  Vector3d flab;
  Vector3d dVangdr;
  Vector3d dvdr;
  Vector3d dVangdu;
  Vector3d dVmorsedr;
  RotMat3x3d Atrans;
  RectMatrix<double,_3U,_3U> local_1e0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double local_170;
  Vector<double,_3U> local_168;
  Vector<double,_3U> local_148;
  Vector<double,_3U> local_130;
  Vector<double,_3U> local_118;
  Vector<double,_3U> local_100;
  double local_e8;
  double dStack_e0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_b8;
  Vector<double,_3U> local_a0;
  RectMatrix<double,_3U,_3U> local_88;
  Vector<double,_3U> local_40;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar2 = (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar2[idat->atid1]].
                    super__Vector_base<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar5 = (long)piVar2[idat->atid2] * 0x30;
  dVar11 = *(double *)(lVar3 + lVar5);
  dVar12 = *(double *)(lVar3 + 8 + lVar5);
  dVar16 = *(double *)(lVar3 + 0x10 + lVar5);
  dVar1 = *(double *)(lVar3 + 0x18 + lVar5);
  dVar13 = *(double *)(lVar3 + 0x20 + lVar5);
  Vector<double,_3U>::Vector(&local_168);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_88);
  if (*(char *)(lVar3 + 0x29 + lVar5) == '\x01') {
    this_01 = &idat->A1;
    operator*((Vector<double,_3U> *)&local_1e0,(RectMatrix<double,_3U,_3U> *)this_01,
              &(idat->d).super_Vector<double,_3U>);
    Vector3<double>::operator=((Vector3<double> *)&local_168,(Vector<double,_3U> *)&local_1e0);
  }
  else {
    this_01 = &idat->A2;
    operator-(&local_1e0,(OpenMD *)this_01,m);
    operator*(&local_a0,&local_1e0,&(idat->d).super_Vector<double,_3U>);
    Vector3<double>::operator=((Vector3<double> *)&local_168,&local_a0);
  }
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_1e0,this_01);
  RectMatrix<double,_3U,_3U>::operator=(&local_88,&local_1e0);
  dVar8 = -dVar16;
  dVar14 = exp((idat->rij - dVar12) * dVar8);
  if (idat->shiftedPot == false) {
    dVar9 = 0.0;
    uVar6 = 0;
    uVar7 = 0;
    bVar4 = 0;
    if (idat->shiftedForce != true) goto LAB_0020e9e0;
  }
  dVar9 = exp((idat->rcut - dVar12) * dVar8);
  uVar6 = SUB84(dVar9,0);
  uVar7 = (undefined4)((ulong)dVar9 >> 0x20);
  dVar9 = dVar9 * dVar9;
  bVar4 = idat->shiftedPot;
LAB_0020e9e0:
  dVar16 = (dVar11 + dVar11) * dVar16;
  dVar12 = (double)CONCAT44(uVar7,uVar6) + (double)CONCAT44(uVar7,uVar6);
  if ((bVar4 & 1) == 0) {
    RVar15 = idat->rij;
    dVar8 = 0.0;
    if (idat->shiftedForce == true) {
      dVar8 = ((double)CONCAT44(uVar7,uVar6) - dVar9) * dVar16;
      dVar12 = dVar11 * (dVar9 - dVar12) + (RVar15 - idat->rcut) * dVar8;
    }
    else {
      dVar12 = 0.0;
    }
  }
  else {
    dVar12 = dVar11 * (dVar9 - dVar12);
    RVar15 = idat->rij;
    dVar8 = 0.0;
  }
  dVar12 = (dVar14 * dVar14 - (dVar14 + dVar14)) * dVar11 - dVar12;
  local_188 = local_168.data_[0] * local_168.data_[0];
  dVar11 = idat->r2;
  dStack_180 = local_168.data_[1];
  local_198 = dVar13 * local_168.data_[2];
  local_170 = dVar1 / -3.0 + 0.8 + local_198 / RVar15 + (dVar1 * local_188) / dVar11;
  dVar10 = idat->vdwMult * dVar12 * local_170;
  dVar9 = idat->sw * dVar10;
  idat->vpair = dVar10 + idat->vpair;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar9;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar9 + (idat->selePot).data_[1];
  }
  Vector<double,_3U>::Vector(&local_d8);
  local_d8.data_[0] = local_168.data_[0];
  local_d8.data_[1] = local_168.data_[1];
  local_d8.data_[2] = local_168.data_[2];
  operator*(&local_100,dVar16 * (dVar14 - dVar14 * dVar14) - dVar8,&local_d8);
  operator/((Vector<double,_3U> *)&local_1e0,&local_100,idat->rij);
  dVar14 = RVar15 * dVar11;
  dVar11 = dVar11 * dVar11;
  Vector<double,_3U>::Vector(&local_a0,(Vector<double,_3U> *)&local_1e0);
  dVar9 = local_188 * dVar1 * -2.0;
  dVar8 = (dVar1 + dVar1) * local_168.data_[0];
  local_178 = dVar13 * local_168.data_[0];
  local_188 = (dVar8 / idat->r2 + (local_168.data_[0] * dVar9) / dVar11) -
              (local_178 * local_168.data_[2]) / dVar14;
  local_e8 = local_168.data_[1];
  dStack_e0 = local_168.data_[1];
  local_198 = (local_168.data_[1] * dVar9) / dVar11 - (local_198 * local_168.data_[1]) / dVar14;
  dStack_190 = local_168.data_[1];
  dVar16 = idat->rij;
  Vector<double,_3U>::Vector(&local_100);
  local_100.data_[0] = local_188;
  local_100.data_[1] = local_198;
  local_100.data_[2] =
       (dVar13 / dVar16 + (dVar9 * local_168.data_[2]) / dVar11) -
       (local_168.data_[2] * local_168.data_[2] * dVar13) / dVar14;
  operator*(&local_b8,local_170,&local_a0);
  operator*(&local_130,dVar12,&local_100);
  OpenMD::operator+((Vector<double,_3U> *)&local_1e0,&local_b8,&local_130);
  Vector<double,_3U>::Vector(&local_d8,(Vector<double,_3U> *)&local_1e0);
  dVar13 = dVar13 * local_e8;
  dVar11 = idat->rij;
  dVar16 = idat->r2;
  dVar14 = local_178 / dVar11;
  dVar1 = dVar1 * -2.0 * local_e8;
  Vector<double,_3U>::Vector(&local_b8);
  local_b8.data_[0] = dVar13 / dVar11;
  local_b8.data_[1] = (dVar8 * local_168.data_[2]) / dVar16 - dVar14;
  local_b8.data_[2] = (dVar1 * local_168.data_[0]) / dVar16;
  operator*(&local_148,dVar12 * idat->vdwMult,&local_b8);
  operator*((Vector<double,_3U> *)&local_1e0,&local_148,idat->sw);
  Vector<double,_3U>::Vector(&local_130,(Vector<double,_3U> *)&local_1e0);
  if (*(char *)(lVar3 + lVar5 + 0x29) == '\x01') {
    operator*((Vector<double,_3U> *)&local_1e0,&local_88,&local_130);
    this_00 = &idat->t1;
  }
  else {
    operator*((Vector<double,_3U> *)&local_1e0,&local_88,&local_130);
    this_00 = &idat->t2;
  }
  Vector<double,_3U>::add(&this_00->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_1e0);
  operator*((Vector<double,_3U> *)&local_1e0,idat->vdwMult * idat->sw,&local_d8);
  Vector<double,_3U>::Vector(&local_148,(Vector<double,_3U> *)&local_1e0);
  Vector<double,_3U>::Vector(&local_118);
  if (*(char *)(lVar3 + lVar5 + 0x29) == '\x01') {
    operator*((Vector<double,_3U> *)&local_1e0,&local_88,&local_148);
    Vector3<double>::operator=((Vector3<double> *)&local_118,(Vector<double,_3U> *)&local_1e0);
  }
  else {
    operator-(&local_1e0,(OpenMD *)&local_88,m_00);
    operator*(&local_40,&local_1e0,&local_148);
    Vector3<double>::operator=((Vector3<double> *)&local_118,&local_40);
  }
  Vector<double,_3U>::add(&(idat->f1).super_Vector<double,_3U>,&local_118);
  return;
}

Assistant:

void MAW::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    MAWInteractionData& mixer =
        MixingMap[MAWtids[idat.atid1]][MAWtids[idat.atid2]];

    RealType myPot    = 0.0;
    RealType myPotC   = 0.0;
    RealType myDeriv  = 0.0;
    RealType myDerivC = 0.0;

    RealType D_e  = mixer.De;
    RealType R_e  = mixer.Re;
    RealType beta = mixer.beta;
    RealType ca1  = mixer.ca1;
    RealType cb1  = mixer.cb1;

    Vector3d r;
    RotMat3x3d Atrans;
    if (mixer.j_is_Metal) {
      // rotate the inter-particle separation into the two different
      // body-fixed coordinate systems:
      r      = idat.A1 * idat.d;
      Atrans = idat.A1.transpose();
    } else {
      // negative sign because this is the vector from j to i:
      r      = -idat.A2 * idat.d;
      Atrans = idat.A2.transpose();
    }

    // V(r) = D_e exp(-a(r-re)(exp(-a(r-re))-2)

    RealType expt    = -beta * (idat.rij - R_e);
    RealType expfnc  = exp(expt);
    RealType expfnc2 = expfnc * expfnc;

    RealType exptC    = 0.0;
    RealType expfncC  = 0.0;
    RealType expfnc2C = 0.0;

    myPot   = D_e * (expfnc2 - 2.0 * expfnc);
    myDeriv = 2.0 * D_e * beta * (expfnc - expfnc2);

    if (idat.shiftedPot || idat.shiftedForce) {
      exptC    = -beta * (idat.rcut - R_e);
      expfncC  = exp(exptC);
      expfnc2C = expfncC * expfncC;
    }

    if (idat.shiftedPot) {
      myPotC   = D_e * (expfnc2C - 2.0 * expfncC);
      myDerivC = 0.0;
    } else if (idat.shiftedForce) {
      myPotC   = D_e * (expfnc2C - 2.0 * expfncC);
      myDerivC = 2.0 * D_e * beta * (expfncC - expfnc2C);
      myPotC += myDerivC * (idat.rij - idat.rcut);
    } else {
      myPotC   = 0.0;
      myDerivC = 0.0;
    }

    RealType x  = r.x();
    RealType y  = r.y();
    RealType z  = r.z();
    RealType x2 = x * x;
    RealType z2 = z * z;

    RealType r3 = idat.r2 * idat.rij;
    RealType r4 = idat.r2 * idat.r2;

    // angular modulation of morse part of potential to approximate
    // the squares of the two HOMO lone pair orbitals in water:
    //********************** old form*************************
    // s = 1 / (4 pi)
    // ta1 = (s - pz)^2 = (1 - sqrt(3)*cos(theta))^2 / (4 pi)
    // b1 = px^2 = 3 * (sin(theta)*cos(phi))^2 / (4 pi)
    //********************** old form*************************
    // we'll leave out the 4 pi for now

    // new functional form just using the p orbitals.
    // Vmorse(r)*[a*p_x + b p_z + (1-a-b)]
    // which is
    // Vmorse(r)*[a sin^2(theta) cos^2(phi) + b cos(theta) + (1-a-b)]
    // Vmorse(r)*[a*x2/r2 + b*z/r + (1-a-b)]

    RealType Vmorse = (myPot - myPotC);
    RealType Vang = ca1 * x2 / idat.r2 + cb1 * z / idat.rij + (0.8 - ca1 / 3.0);

    RealType pot_temp = idat.vdwMult * Vmorse * Vang;
    idat.vpair += pot_temp;
    idat.pot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += idat.sw * pot_temp;
    Vector3d dVmorsedr = (myDeriv - myDerivC) * Vector3d(x, y, z) / idat.rij;

    Vector3d dVangdr = Vector3d(
        -2.0 * ca1 * x2 * x / r4 + 2.0 * ca1 * x / idat.r2 - cb1 * x * z / r3,
        -2.0 * ca1 * x2 * y / r4 - cb1 * z * y / r3,
        -2.0 * ca1 * x2 * z / r4 + cb1 / idat.rij - cb1 * z2 / r3);

    // chain rule to put these back on x, y, z

    Vector3d dvdr = Vang * dVmorsedr + Vmorse * dVangdr;

    // Torques for Vang using method of Price:
    // S. L. Price, A. J. Stone, and M. Alderton, Mol. Phys. 52, 987 (1984).

    Vector3d dVangdu = Vector3d(
        cb1 * y / idat.rij, 2.0 * ca1 * x * z / idat.r2 - cb1 * x / idat.rij,
        -2.0 * ca1 * y * x / idat.r2);

    // do the torques first since they are easy:
    // remember that these are still in the body fixed axes

    Vector3d trq = idat.vdwMult * Vmorse * dVangdu * idat.sw;

    // go back to lab frame using transpose of rotation matrix:

    if (mixer.j_is_Metal) {
      idat.t1 += Atrans * trq;
    } else {
      idat.t2 += Atrans * trq;
    }

    // Now, on to the forces (still in body frame of water)

    Vector3d ftmp = idat.vdwMult * idat.sw * dvdr;

    // rotate the terms back into the lab frame:
    Vector3d flab;
    if (mixer.j_is_Metal) {
      flab = Atrans * ftmp;
    } else {
      flab = -Atrans * ftmp;
    }

    idat.f1 += flab;

    return;
  }